

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O1

void __thiscall
Lib::
Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
::~Recycled(Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
            *this)

{
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *pDVar1;
  Stack<std::unique_ptr<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>_>
  *this_00;
  pointer *__ptr;
  void **head;
  
  pDVar1 = *(DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> **)this;
  if (((pDVar1 != (DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x0)
      && (0 < pDVar1->_capacity)) &&
     (Recycled<Lib::DHMap<unsigned_int,Kernel::TermList,Lib::DefaultHash,Lib::DefaultHash2>,Lib::DefaultReset,Lib::DefaultKeepRecycled>
      ::memAlive == '\x01')) {
    DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::reset(pDVar1);
    this_00 = mem();
    pDVar1 = *(DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> **)this;
    *(undefined8 *)this = 0;
    if (this_00->_cursor == this_00->_end) {
      Stack<std::unique_ptr<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>_>
      ::expand(this_00);
    }
    (this_00->_cursor->_M_t).
    super___uniq_ptr_impl<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
    .
    super__Head_base<0UL,_Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
    ._M_head_impl = pDVar1;
    this_00->_cursor = this_00->_cursor + 1;
  }
  pDVar1 = *(DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> **)this;
  if (pDVar1 != (DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x0) {
    DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap(pDVar1);
    pDVar1->_timestamp = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
    pDVar1->_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
    GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pDVar1;
  }
  *(undefined8 *)this = 0;
  return;
}

Assistant:

~Recycled()
  {
    if (IF_USE_PTRS(_self, true) && _keep(self()) && memAlive) {
      _reset(self());
      mem().push(std::move(_self));
    }
  }